

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINChecksum.cpp
# Opt level: O3

U8 __thiscall LINChecksum::add(LINChecksum *this,U8 byte)

{
  ushort uVar1;
  undefined1 in_register_00000031;
  ushort uVar2;
  
  uVar2 = CONCAT11(in_register_00000031,byte) + this->mChecksum;
  uVar1 = uVar2 - 0xff;
  if (uVar2 < 0x100) {
    uVar1 = uVar2;
  }
  this->mChecksum = uVar1;
  return (U8)uVar1;
}

Assistant:

U8 LINChecksum::add( U8 byte )
{
    mChecksum += byte;
    if( mChecksum >= 256 )
        mChecksum -= 255;

    // if ( mChecksum & 0x100 ) // carry?
    //	mChecksum += 1;
    return ( U8 )( mChecksum & 0xFF );
}